

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdlogger.cpp
# Opt level: O0

void __thiscall CfdLogger_WriteLog_Test::TestBody(CfdLogger_WriteLog_Test *this)

{
  bool bVar1;
  AssertHelper local_70;
  Message local_68;
  allocator local_59;
  string local_58;
  undefined1 local_28 [8];
  CfdSourceLocation loc;
  CfdLogger_WriteLog_Test *this_local;
  
  local_28 = (undefined1  [8])0x760f26;
  loc.filename = (char *)0x0;
  loc._8_8_ = (long)"%s from %s (%s ms total)\n\n" + 0x1a;
  loc.funcname = (char *)this;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_58,"",&local_59);
      cfd::core::logger::WriteLog((CfdSourceLocation *)local_28,kCfdLogLevelInfo,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      std::allocator<char>::~allocator((allocator<char> *)&local_59);
    }
  }
  else {
    testing::Message::Message(&local_68);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_cfdlogger.cpp"
               ,0x16,
               "Expected: (WriteLog(loc, CfdLogLevel::kCfdLogLevelInfo, \"\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_70,&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::Message::~Message(&local_68);
  }
  return;
}

Assistant:

TEST(CfdLogger, WriteLog) {
  CfdSourceLocation loc {"", 0, ""};
  EXPECT_NO_THROW((WriteLog(loc, CfdLogLevel::kCfdLogLevelInfo, "")));
}